

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int mtx_trylock(mtx_t *mtx)

{
  int iVar1;
  int iVar2;
  mtx_t *mtx_local;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mtx);
  iVar2 = 3;
  if (iVar1 == 0) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int mtx_trylock(mtx_t *mtx)
{
#if defined(_TTHREAD_WIN32_)
  int ret = TryEnterCriticalSection(&mtx->mHandle) ? thrd_success : thrd_busy;
  if ((!mtx->mRecursive) && (ret == thrd_success) && mtx->mAlreadyLocked)
  {
    LeaveCriticalSection(&mtx->mHandle);
    ret = thrd_busy;
  }
  return ret;
#else
  return (pthread_mutex_trylock(mtx) == 0) ? thrd_success : thrd_busy;
#endif
}